

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void lj_gc_barrierf(global_State *g,GCobj *o,GCobj *v)

{
  long in_RSI;
  GCobj *in_RDI;
  
  if ((*(char *)((long)in_RDI + 0x59) == '\x01') || (*(char *)((long)in_RDI + 0x59) == '\x02')) {
    gc_mark((global_State *)&v->gch,in_RDI);
  }
  else {
    *(byte *)(in_RSI + 4) = *(byte *)(in_RSI + 4) & 0xf8 | *(byte *)((long)in_RDI + 0x58) & 3;
  }
  return;
}

Assistant:

void lj_gc_barrierf(global_State *g, GCobj *o, GCobj *v)
{
  lj_assertG(isblack(o) && iswhite(v) && !isdead(g, v) && !isdead(g, o),
	     "bad object states for forward barrier");
  lj_assertG(g->gc.state != GCSfinalize && g->gc.state != GCSpause,
	     "bad GC state");
  lj_assertG(o->gch.gct != ~LJ_TTAB, "barrier object is not a table");
  /* Preserve invariant during propagation. Otherwise it doesn't matter. */
  if (g->gc.state == GCSpropagate || g->gc.state == GCSatomic)
    gc_mark(g, v);  /* Move frontier forward. */
  else
    makewhite(g, o);  /* Make it white to avoid the following barrier. */
}